

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

size_t ll_free(ll_node *node)

{
  ll_node *plVar1;
  ll_node *local_30;
  size_t count;
  ll_node *next_node;
  ll_node *cur_node;
  ll_node *node_local;
  
  local_30 = (ll_node *)0x0;
  next_node = node;
  if (node == (ll_node *)0x0) {
    node_local = (ll_node *)0x0;
  }
  else {
    do {
      plVar1 = next_node->next;
      ll_free_node(next_node);
      local_30 = (ll_node *)((long)&local_30->value_ptr + 1);
      next_node = plVar1;
      node_local = local_30;
    } while (plVar1 != (ll_node *)0x0);
  }
  return (size_t)node_local;
}

Assistant:

size_t ll_free(struct ll_node *node)
{
	struct ll_node *cur_node = node;
	struct ll_node *next_node = NULL;
	size_t count = 0;
	if (node == NULL) {
		return 0;
	}
	do {
		next_node = cur_node->next;
		ll_free_node(cur_node);
		cur_node = next_node;
		count++;
	} while (cur_node != NULL);
	return count;
}